

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ack_message.h
# Opt level: O0

size_t __thiscall
std::hash<bidfx_public_api::price::pixie::AckMessage>::operator()
          (hash<bidfx_public_api::price::pixie::AckMessage> *this,AckMessage *message)

{
  long lVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  hash<long> local_1d;
  hash<long> local_1c;
  hash<long> local_1b;
  hash<long> local_1a;
  hash<long> local_19;
  AckMessage *local_18;
  AckMessage *message_local;
  hash<bidfx_public_api::price::pixie::AckMessage> *this_local;
  
  local_18 = message;
  message_local = (AckMessage *)this;
  lVar1 = bidfx_public_api::price::pixie::AckMessage::GetRevision();
  sVar2 = hash<long>::operator()(&local_19,lVar1);
  lVar1 = bidfx_public_api::price::pixie::AckMessage::GetAckTime();
  sVar3 = hash<long>::operator()(&local_1a,lVar1);
  lVar1 = bidfx_public_api::price::pixie::AckMessage::GethandlingDurationMicros();
  sVar4 = hash<long>::operator()(&local_1b,lVar1);
  lVar1 = bidfx_public_api::price::pixie::AckMessage::GetPriceReceivedTime();
  sVar5 = hash<long>::operator()(&local_1c,lVar1);
  lVar1 = bidfx_public_api::price::pixie::AckMessage::GetRevisionTime();
  sVar6 = hash<long>::operator()(&local_1d,lVar1);
  return sVar2 ^ sVar3 ^ sVar4 ^ sVar5 ^ sVar6;
}

Assistant:

std::size_t operator()(const AckMessage &message) const {
        return std::hash<long>()(message.GetRevision()) ^
               std::hash<long>()(message.GetAckTime()) ^
               std::hash<long>()(message.GethandlingDurationMicros()) ^
               std::hash<long>()(message.GetPriceReceivedTime()) ^
               std::hash<long>()(message.GetRevisionTime());
    }